

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void h_predictor_16xh(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int count)

{
  long lVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t *puVar10;
  int iVar11;
  __m128i left_col_8p_hi;
  __m128i left_col_8p_lo;
  uint8_t local_58;
  uint8_t uStack_57;
  uint8_t uStack_56;
  uint8_t uStack_55;
  uint8_t uStack_54;
  uint8_t uStack_53;
  uint8_t uStack_52;
  uint8_t uStack_51;
  uint8_t uStack_50;
  uint8_t uStack_4f;
  uint8_t uStack_4e;
  uint8_t uStack_4d;
  uint8_t uStack_4c;
  uint8_t uStack_4b;
  uint8_t uStack_4a;
  uint8_t uStack_49;
  uint8_t local_48;
  uint8_t uStack_47;
  uint8_t uStack_46;
  uint8_t uStack_45;
  uint8_t uStack_44;
  uint8_t uStack_43;
  uint8_t uStack_42;
  uint8_t uStack_41;
  uint8_t uStack_40;
  uint8_t uStack_3f;
  uint8_t uStack_3e;
  uint8_t uStack_3d;
  uint8_t uStack_3c;
  uint8_t uStack_3b;
  uint8_t uStack_3a;
  uint8_t uStack_39;
  
  lVar1 = stride * 4;
  iVar11 = 0;
  do {
    local_48 = *left;
    uStack_46 = left[1];
    uStack_44 = left[2];
    uStack_42 = left[3];
    uStack_40 = left[4];
    uStack_3e = left[5];
    uStack_3c = left[6];
    uStack_3a = left[7];
    uVar2 = left[8];
    uVar3 = left[9];
    uVar4 = left[10];
    uVar5 = left[0xb];
    uVar6 = left[0xc];
    uVar7 = left[0xd];
    uVar8 = left[0xe];
    uVar9 = left[0xf];
    uStack_47 = local_48;
    uStack_45 = uStack_46;
    uStack_43 = uStack_44;
    uStack_41 = uStack_42;
    uStack_3f = uStack_40;
    uStack_3d = uStack_3e;
    uStack_3b = uStack_3c;
    uStack_39 = uStack_3a;
    h_prediction_16x8_1((__m128i *)&local_48,dst,stride);
    puVar10 = dst + lVar1;
    h_prediction_16x8_2((__m128i *)&local_48,puVar10,stride);
    puVar10 = puVar10 + lVar1;
    local_58 = uVar2;
    uStack_57 = uVar2;
    uStack_56 = uVar3;
    uStack_55 = uVar3;
    uStack_54 = uVar4;
    uStack_53 = uVar4;
    uStack_52 = uVar5;
    uStack_51 = uVar5;
    uStack_50 = uVar6;
    uStack_4f = uVar6;
    uStack_4e = uVar7;
    uStack_4d = uVar7;
    uStack_4c = uVar8;
    uStack_4b = uVar8;
    uStack_4a = uVar9;
    uStack_49 = uVar9;
    h_prediction_16x8_1((__m128i *)&local_58,puVar10,stride);
    h_prediction_16x8_2((__m128i *)&local_58,puVar10 + lVar1,stride);
    dst = puVar10 + lVar1 + lVar1;
    left = left + 0x10;
    iVar11 = iVar11 + 1;
  } while (iVar11 < count);
  return;
}

Assistant:

static inline void h_predictor_16xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *left, int count) {
  int i = 0;
  do {
    const __m128i left_col = _mm_load_si128((const __m128i *)left);
    const __m128i left_col_8p_lo = _mm_unpacklo_epi8(left_col, left_col);
    h_prediction_16x8_1(&left_col_8p_lo, dst, stride);
    dst += stride << 2;
    h_prediction_16x8_2(&left_col_8p_lo, dst, stride);
    dst += stride << 2;

    const __m128i left_col_8p_hi = _mm_unpackhi_epi8(left_col, left_col);
    h_prediction_16x8_1(&left_col_8p_hi, dst, stride);
    dst += stride << 2;
    h_prediction_16x8_2(&left_col_8p_hi, dst, stride);
    dst += stride << 2;

    left += 16;
    i++;
  } while (i < count);
}